

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::HttpOutputStream::HttpOutputStream
          (HttpOutputStream *this,AsyncOutputStream *inner)

{
  AsyncOutputStream *inner_local;
  HttpOutputStream *this_local;
  
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>);
  this->inner = inner;
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&this->writeQueue);
  this->inBody = false;
  this->broken = false;
  this->writeInProgress = false;
  return;
}

Assistant:

HttpOutputStream(AsyncOutputStream& inner): inner(inner) {}